

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O1

void __thiscall
cmCTestCVS::LoadRevisions
          (cmCTestCVS *this,string *file,char *branchFlag,
          vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *revisions)

{
  cmCTest *this_00;
  OutputLogger err;
  char *cvs_log [6];
  LogParser out;
  OutputLogger local_468;
  pointer local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  pointer local_408;
  undefined8 local_400;
  undefined1 local_3f0 [272];
  char *local_2e0;
  char *local_210;
  char *local_140;
  Revision local_128;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,".",1);
  std::ostream::flush();
  this_00 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCVS.cxx"
               ,0xda,(char *)local_468.super_LineParser.super_OutputParser._vptr_OutputParser,false)
  ;
  if (local_468.super_LineParser.super_OutputParser._vptr_OutputParser !=
      (_func_int **)&local_468.super_LineParser.Prefix) {
    operator_delete(local_468.super_LineParser.super_OutputParser._vptr_OutputParser,
                    (ulong)(local_468.super_LineParser.Prefix + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
  std::ios_base::~ios_base((ios_base *)(local_3f0 + 0x70));
  local_428 = (this->super_cmCTestVC).CommandLineTool._M_dataplus._M_p;
  local_420 = "log";
  local_418 = "-N";
  local_408 = (file->_M_dataplus)._M_p;
  local_400 = 0;
  local_410 = branchFlag;
  LogParser::LogParser((LogParser *)local_3f0,this,"log-out> ",revisions);
  cmProcessTools::OutputLogger::OutputLogger(&local_468,(this->super_cmCTestVC).Log,"log-err> ");
  cmCTestVC::RunChild(&this->super_cmCTestVC,&local_428,(OutputParser *)local_3f0,
                      (OutputParser *)&local_468,(char *)0x0,Auto);
  local_468.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_006a4518;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468.super_LineParser.Line._M_dataplus._M_p !=
      &local_468.super_LineParser.Line.field_2) {
    operator_delete(local_468.super_LineParser.Line._M_dataplus._M_p,
                    local_468.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_3f0._0_8_ = &PTR__LogParser_006a22b8;
  cmCTestVC::Revision::~Revision(&local_128);
  if (local_140 != (char *)0x0) {
    operator_delete__(local_140);
  }
  if (local_210 != (char *)0x0) {
    operator_delete__(local_210);
  }
  if (local_2e0 != (char *)0x0) {
    operator_delete__(local_2e0);
  }
  local_3f0._0_8_ = &PTR__LineParser_006a4518;
  if ((undefined1 *)local_3f0._24_8_ != local_3f0 + 0x28) {
    operator_delete((void *)local_3f0._24_8_,local_3f0._40_8_ + 1);
  }
  return;
}

Assistant:

void cmCTestCVS::LoadRevisions(std::string const& file, const char* branchFlag,
                               std::vector<Revision>& revisions)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "." << std::flush);

  // Run "cvs log" to get revisions of this file on this branch.
  const char* cvs = this->CommandLineTool.c_str();
  const char* cvs_log[] = {
    cvs, "log", "-N", branchFlag, file.c_str(), nullptr
  };

  LogParser out(this, "log-out> ", revisions);
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(cvs_log, &out, &err);
}